

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater.cpp
# Opt level: O2

void __thiscall
hiberlite::UpdateBean::commitRow(UpdateBean *this,shared_connection *con,sqlid_t rowid)

{
  sqlite3 *db;
  abstract_atom *paVar1;
  int iVar2;
  RowScope *pRVar3;
  statement_ptr *tg;
  size_type sVar4;
  runtime_error *this_00;
  logic_error *this_01;
  longlong *val;
  size_t i;
  ulong uVar5;
  allocator local_109;
  shared_connection local_108;
  shared_connection local_f8;
  shared_stmt statement;
  sqlid_t rowid_local;
  sqlite3_stmt *stmt_ptr;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  rowid_local = rowid;
  pRVar3 = curRow(this);
  if (pRVar3->needComma == false) {
    std::
    deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
    ::pop_back((deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                *)this);
    return;
  }
  if (pRVar3->id == rowid) {
    std::__cxx11::string::string((string *)&local_80," WHERE ",&local_109);
    std::operator+(&local_60,&local_80,"hiberlite_id");
    std::operator+(&local_40,&local_60,"=");
    Transformer::toSQLiteValue_abi_cxx11_(&local_a0,(Transformer *)&rowid_local,val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stmt_ptr,
                   &local_40,&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&statement,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stmt_ptr,
                   ";");
    pRVar3 = curRow(this);
    std::__cxx11::string::append((string *)&pRVar3->query);
    std::__cxx11::string::~string((string *)&statement);
    std::__cxx11::string::~string((string *)&stmt_ptr);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    stmt_ptr = (sqlite3_stmt *)0x0;
    db = con->res->res->con;
    pRVar3 = curRow(this);
    iVar2 = sqlite3_prepare_v2(db,(pRVar3->query)._M_dataplus._M_p,-1,&stmt_ptr,(char **)&statement)
    ;
    local_f8._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_f8.res = con->res;
    if (local_f8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_f8.res)->refCount = (local_f8.res)->refCount + 1;
    }
    database_error::database_assert(iVar2,&local_f8);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_f8);
    tg = (statement_ptr *)operator_new(8);
    tg->obj = stmt_ptr;
    shared_res<hiberlite::statement_ptr>::shared_res(&statement,tg);
    uVar5 = 0;
    while( true ) {
      pRVar3 = curRow(this);
      if ((ulong)((long)(pRVar3->atoms).
                        super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pRVar3->atoms).
                        super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) break;
      pRVar3 = curRow(this);
      paVar1 = (pRVar3->atoms).
               super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5];
      (**paVar1->_vptr_abstract_atom)(paVar1,(statement.res)->res->obj,(ulong)((int)uVar5 + 100));
      uVar5 = uVar5 + 1;
    }
    iVar2 = sqlite3_step((statement.res)->res->obj);
    if (iVar2 != 0x65) {
      local_108._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
      local_108.res = con->res;
      if (local_108.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_108.res)->refCount = (local_108.res)->refCount + 1;
      }
      database_error::database_assert(iVar2,&local_108);
      shared_res<hiberlite::autoclosed_con>::~shared_res(&local_108);
    }
    sVar4 = std::
            deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
            ::size((deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                    *)this);
    if (sVar4 != 0) {
      std::
      deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
      ::pop_back((deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                  *)this);
      shared_res<hiberlite::statement_ptr>::~shared_res(&statement);
      return;
    }
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"UpdateVisitor: commit row, but no row started");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"rowid mismatch");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void UpdateBean::commitRow(shared_connection con, sqlid_t rowid)
{
	if(!curRow()->needComma){
		rowStack.pop();
		return;
	}
	if(rowid!=curRow()->id)
		throw std::runtime_error("rowid mismatch");
	curRow()->query+=std::string(" WHERE ")+ HIBERLITE_PRIMARY_KEY_COLUMN + "="+ Transformer::toSQLiteValue(rowid) +";";

	sqlite3_stmt* stmt_ptr=NULL;
	{
		sqlite3* db=con->getSQLite3Ptr();
		const char* foob;
		int rc=sqlite3_prepare_v2(db,curRow()->query.c_str(),-1,&stmt_ptr,&foob);
		database_error::database_assert(rc, con);
	}
	shared_stmt statement( new statement_ptr(stmt_ptr) );

	for(size_t i=0;i<curRow()->atoms.size();i++){
		curRow()->atoms[i]->bindValue(statement->get_stmt(), static_cast<int>(i)+RowScope::FirstAtom);
	}

	{
		int rc=sqlite3_step(statement->get_stmt());
		if(rc!=SQLITE_DONE)
			database_error::database_assert(rc, con);
	}


	if(!rowStack.size())
		throw std::logic_error("UpdateVisitor: commit row, but no row started");

	rowStack.pop();
}